

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
zeGetEventPoolProcAddrTable(ze_api_version_t version,ze_event_pool_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_event_pool_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnCreate = driver::zeEventPoolCreate;
      pDdiTable->pfnDestroy = driver::zeEventPoolDestroy;
      pDdiTable->pfnGetIpcHandle = driver::zeEventPoolGetIpcHandle;
      pDdiTable->pfnOpenIpcHandle = driver::zeEventPoolOpenIpcHandle;
      pDdiTable->pfnCloseIpcHandle = driver::zeEventPoolCloseIpcHandle;
      pDdiTable->pfnPutIpcHandle = driver::zeEventPoolPutIpcHandle;
      pDdiTable->pfnGetContextHandle = driver::zeEventPoolGetContextHandle;
      pDdiTable->pfnGetFlags = driver::zeEventPoolGetFlags;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetEventPoolProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_event_pool_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnCreate                                 = driver::zeEventPoolCreate;

    pDdiTable->pfnDestroy                                = driver::zeEventPoolDestroy;

    pDdiTable->pfnGetIpcHandle                           = driver::zeEventPoolGetIpcHandle;

    pDdiTable->pfnOpenIpcHandle                          = driver::zeEventPoolOpenIpcHandle;

    pDdiTable->pfnCloseIpcHandle                         = driver::zeEventPoolCloseIpcHandle;

    pDdiTable->pfnPutIpcHandle                           = driver::zeEventPoolPutIpcHandle;

    pDdiTable->pfnGetContextHandle                       = driver::zeEventPoolGetContextHandle;

    pDdiTable->pfnGetFlags                               = driver::zeEventPoolGetFlags;

    return result;
}